

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

string * __thiscall
fasttext::Args::getAutotuneMetricLabel_abi_cxx11_(string *__return_storage_ptr__,Args *this)

{
  metric_name mVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  mVar1 = getAutotuneMetric(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (mVar1 == f1scoreLabel) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&this->autotuneMetric);
  }
  else {
    if ((mVar1 & recallAtPrecision) != precisionAtRecallLabel) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::find((char *)&this->autotuneMetric,0x13ed7f,0x12);
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&this->autotuneMetric);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"Empty metric label : ",&this->autotuneMetric);
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string Args::getAutotuneMetricLabel() const {
  metric_name metric = getAutotuneMetric();
  std::string label;
  if (metric == metric_name::f1scoreLabel) {
    label = autotuneMetric.substr(3);
  } else if (
      metric == metric_name::precisionAtRecallLabel ||
      metric == metric_name::recallAtPrecisionLabel) {
    size_t semicolon = autotuneMetric.find(":", 18);
    label = autotuneMetric.substr(semicolon + 1);
  } else {
    return label;
  }

  if (label.empty()) {
    throw std::runtime_error("Empty metric label : " + autotuneMetric);
  }
  return label;
}